

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall
FTypeTable::ReplaceType(FTypeTable *this,PType *newtype,PType *oldtype,size_t bucket)

{
  PType *pPVar1;
  PType *pPVar2;
  PType **ppPVar3;
  
  pPVar2 = this->TypeHash[bucket];
  if (pPVar2 == (PType *)0x0) {
    return;
  }
  if (pPVar2 == oldtype) {
    ppPVar3 = this->TypeHash + bucket;
  }
  else {
    do {
      pPVar1 = pPVar2;
      pPVar2 = pPVar1->HashNext;
      if (pPVar2 == (PType *)0x0) {
        return;
      }
    } while (pPVar2 != oldtype);
    ppPVar3 = &pPVar1->HashNext;
  }
  newtype->HashNext = pPVar2->HashNext;
  pPVar2->HashNext = (PType *)0x0;
  *ppPVar3 = newtype;
  return;
}

Assistant:

void FTypeTable::ReplaceType(PType *newtype, PType *oldtype, size_t bucket)
{
	for (PType **type_p = &TypeHash[bucket]; *type_p != NULL; type_p = &(*type_p)->HashNext)
	{
		PType *type = *type_p;
		if (type == oldtype)
		{
			newtype->HashNext = type->HashNext;
			type->HashNext = NULL;
			*type_p = newtype;
			break;
		}
	}
}